

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::initsamplesize(aalcalc *this,string *path)

{
  undefined8 uVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  FILE *__stream;
  undefined8 extraout_RAX;
  bool bVar5;
  string s;
  int summarycalcstream_type;
  undefined1 local_98 [40];
  undefined1 *local_70;
  undefined1 local_60 [16];
  _Base_ptr local_50 [4];
  
  local_98._32_8_ = path;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    do {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) {
        return;
      }
      local_98._0_8_ = local_98 + 0x10;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,pdVar3->d_name,pdVar3->d_name + sVar4);
      uVar1 = local_98._8_8_;
      if ((ulong)local_98._8_8_ < 5) {
        bVar5 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)local_98);
        iVar2 = std::__cxx11::string::compare((char *)local_50);
        bVar5 = iVar2 == 0;
      }
      if ((4 < (ulong)uVar1) && (local_50[0] != (_Base_ptr)(local_50 + 2))) {
        operator_delete(local_50[0]);
      }
      if (bVar5) {
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,*(long *)local_98._32_8_,
                   (long)&(*(_Base_ptr *)(local_98._32_8_ + 8))->_M_color + *(long *)local_98._32_8_
                  );
        std::__cxx11::string::append((char *)&local_70);
        std::__cxx11::string::operator=((string *)local_98,(string *)&local_70);
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        __stream = fopen((char *)local_98._0_8_,"rb");
        if (__stream == (FILE *)0x0) {
          initsamplesize((aalcalc *)local_98);
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_);
          }
          _Unwind_Resume(extraout_RAX);
        }
        local_70 = (undefined1 *)((ulong)local_70 & 0xffffffff00000000);
        fread((string *)&local_70,4,1,__stream);
        fread(&this->samplesize_,4,1,__stream);
        fclose(__stream);
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
    } while (!bVar5);
  }
  return;
}

Assistant:

void aalcalc::initsamplesize(const std::string &path)
{
	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				FILE *fin = fopen(s.c_str(), "rb");
				if (fin == NULL) {
					fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
					exit(EXIT_FAILURE);
				}
				int summarycalcstream_type = 0;
				fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
				fread(&samplesize_, sizeof(samplesize_), 1, fin);
				fclose(fin);
				break;
			}

		}
	}
}